

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::indirection
          (Compiler *this,Ptr *node,Class *reference_class,string *path,
          vector<short,_std::allocator<short>_> *indices,ReturnType expected_type)

{
  Metadata *this_00;
  bool bVar1;
  long lVar2;
  iterator iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  ReturnType unaff_R15D;
  uint16_t index;
  Compiler *local_f8;
  vector<short,_std::allocator<short>_> *local_f0;
  Class *fetched_class;
  ReturnType local_dc;
  key_type local_d8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_80;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f8 = this;
  local_f0 = indices;
  local_dc = expected_type;
  local_b8 = &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
  do {
    if (path->_M_string_length == 0) {
LAB_00132f5a:
      return local_dc == ANY || unaff_R15D == local_dc;
    }
    lVar2 = std::__cxx11::string::find((char *)path,0x14672b);
    std::__cxx11::string::substr((ulong)&name,(ulong)path);
    bVar1 = std::operator==(&name,"vw");
    if (bVar1) {
      this_00 = local_f8->_metadata;
      std::__cxx11::string::string((string *)&local_d8,"pgm_view",(allocator *)&local_b0);
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this_00,&local_d8);
      fetched_class =
           (Class *)((long)iVar3.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                           ._M_cur + 0x28);
      std::__cxx11::string::~string((string *)&local_d8);
      local_d8._M_dataplus._M_p._0_2_ = 0xffff;
      std::vector<short,_std::allocator<short>_>::emplace_back<short>(local_f0,(short *)&local_d8);
      unaff_R15D = ANY;
    }
    else {
      bVar1 = std::operator==(&name,"mks");
      if (bVar1) {
        fetched_class = (Class *)0x0;
        local_d8._M_dataplus._M_p._0_2_ = 0xfffe;
        std::vector<short,_std::allocator<short>_>::emplace_back<short>(local_f0,(short *)&local_d8)
        ;
      }
      else {
        bVar1 = std::operator==(&name,"vws");
        if (!bVar1) {
          bVar1 = Class::get_member_index
                            (reference_class,local_f8->_metadata,&name,&index,&fetched_class);
          if (!bVar1) {
            std::operator+(&local_50," error: ",&name);
            std::operator+(&local_b0,&local_50," is not a member of ");
            std::operator+(&local_d8,&local_b0,&reference_class->str_opcode);
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_80,local_b8);
            set_error(local_f8,&local_d8,(Ptr *)&local_80);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
            std::__cxx11::string::~string((string *)&local_d8);
            std::__cxx11::string::~string((string *)&local_b0);
            this_01 = &local_50;
            goto LAB_00132fdf;
          }
          unaff_R15D = Class::get_member_type(reference_class,index);
          local_d8._M_dataplus._M_p._0_2_ = index;
          std::vector<short,_std::allocator<short>_>::emplace_back<short>
                    (local_f0,(short *)&local_d8);
          goto LAB_00132f20;
        }
        fetched_class = (Class *)0x0;
        local_d8._M_dataplus._M_p._0_2_ = 0xfffd;
        std::vector<short,_std::allocator<short>_>::emplace_back<short>(local_f0,(short *)&local_d8)
        ;
      }
      unaff_R15D = SET;
    }
LAB_00132f20:
    reference_class = fetched_class;
    if (lVar2 == -1) {
      std::__cxx11::string::~string((string *)&name);
      goto LAB_00132f5a;
    }
    if (fetched_class == (Class *)0x0) {
      std::operator+(&local_b0," error: ",&name);
      std::operator+(&local_d8,&local_b0," is not an addressable structure");
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_90,local_b8);
      set_error(local_f8,&local_d8,(Ptr *)&local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      std::__cxx11::string::~string((string *)&local_d8);
      this_01 = &local_b0;
LAB_00132fdf:
      std::__cxx11::string::~string((string *)this_01);
      std::__cxx11::string::~string((string *)&name);
      return false;
    }
    std::__cxx11::string::erase((ulong)path,0);
    std::__cxx11::string::~string((string *)&name);
  } while( true );
}

Assistant:

bool Compiler::indirection(RepliStruct::Ptr node, Class *reference_class, std::string path, std::vector<int16_t> *indices, const ReturnType expected_type)
{
    uint16_t index;
    Class *fetched_class;
    ReturnType type;

    while (path.length() > 0) {
        size_t pos = path.find(".");
        std::string name = path.substr(0, pos);

        if (name == "vw") {
            fetched_class = &_metadata->classes.find("pgm_view")->second;
            type = ANY;
            indices->push_back(-1);
        } else if (name == "mks") {
            fetched_class = nullptr;
            type = SET;
            indices->push_back(-2);
        } else if (name == "vws") {
            fetched_class = nullptr;
            type = SET;
            indices->push_back(-3);
        } else if (!reference_class->get_member_index(_metadata, name, index, fetched_class)) {
            set_error(" error: " + name + " is not a member of " + reference_class->str_opcode, node);
            return false;
        } else {
            type = reference_class->get_member_type(index);
            indices->push_back(index);
        }

        // No more dots
        if (pos == std::string::npos) {
            break;
        }

        if (!fetched_class) {
            set_error(" error: " + name + " is not an addressable structure", node);
            return false;
        }

        reference_class = fetched_class;
        path.erase(0, pos + 1); // Remove fetched name + .
    }

    if (type == expected_type || expected_type == ANY) {
        return true;
    } else {
        return false;
    }
}